

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

void __thiscall TGAImage::scale(TGAImage *this,size_t w,size_t h)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tdata;
  allocator_type local_7a;
  value_type_conflict2 local_79;
  size_t local_78;
  size_t local_70;
  uint local_68;
  int local_64;
  int local_60;
  uint local_5c;
  long local_58;
  size_t local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if ((h != 0 && w != 0) &&
     ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    local_79 = '\0';
    local_78 = w;
    local_70 = h;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
               (ulong)this->bytespp * h * w,&local_79,&local_7a);
    uVar1 = this->height;
    local_50 = (size_t)(int)(this->bytespp * (int)w);
    local_58 = (long)(int)(this->bytespp * this->width);
    lVar6 = 0;
    lVar5 = 0;
    iVar9 = 0;
    uVar3 = 0;
    while (uVar3 < uVar1) {
      uVar1 = this->width;
      iVar2 = uVar1 - (int)local_78;
      iVar8 = -this->bytespp;
      lVar5 = (long)(int)lVar5;
      uVar4 = 0;
      iVar7 = iVar8;
      local_68 = uVar3;
      local_64 = iVar9;
      while (__n = local_50, uVar4 < uVar1) {
        local_60 = iVar7 + this->bytespp;
        lVar10 = (long)local_60;
        iVar2 = iVar2 + (int)local_78;
        local_5c = uVar4;
        while (iVar9 = iVar2 - uVar1, (int)uVar1 <= iVar2) {
          iVar8 = iVar8 + this->bytespp;
          memcpy(local_48._M_impl.super__Vector_impl_data._M_start + iVar8 + lVar5,
                 (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar10 + lVar6,(ulong)this->bytespp);
          iVar2 = iVar9;
          uVar1 = this->width;
        }
        iVar7 = local_60;
        uVar4 = local_5c + 1;
      }
      uVar1 = this->height;
      for (iVar9 = local_64 + (int)local_70; (int)uVar1 <= iVar9; iVar9 = iVar9 - uVar1) {
        if (SBORROW4(iVar9,uVar1 * 2) == (int)(iVar9 + uVar1 * -2) < 0) {
          memcpy(local_48._M_impl.super__Vector_impl_data._M_start + lVar5 + __n,
                 local_48._M_impl.super__Vector_impl_data._M_start + lVar5,__n);
          uVar1 = this->height;
        }
        lVar5 = lVar5 + __n;
      }
      lVar6 = lVar6 + local_58;
      uVar3 = local_68 + 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->data,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    this->width = (uint32_t)local_78;
    this->height = (uint32_t)local_70;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void TGAImage::scale(size_t w, size_t h)
{
    if (w <= 0 || h <= 0 || !data.size()) return;
    std::vector<std::uint8_t> tdata(w * h * bytespp, 0);
    int n_scanline = 0;
    int oscanline = 0;
    int err_y = 0;
    int n_line_bytes = w * bytespp;
    int olinebytes = width * bytespp;
    for (uint32_t j = 0; j < height; j++) {
        int errx = width - w;
        int nx = -static_cast<int>(bytespp);
        int ox = -static_cast<int>(bytespp);
        for (uint32_t i = 0; i < width; i++) {
            ox += bytespp;
            errx += w;
            while (errx >= (int)width) {
                errx -= width;
                nx += bytespp;
                memcpy(tdata.data() + n_scanline + nx, data.data() + oscanline + ox, bytespp);
            }
        }
        err_y += h;
        oscanline += olinebytes;
        while (err_y >= (int)height) {
            if (err_y >= (int)height << 1)  // it means we jump over a scanline
                memcpy(tdata.data() + n_scanline + n_line_bytes, tdata.data() + n_scanline,
                       n_line_bytes);
            err_y -= height;
            n_scanline += n_line_bytes;
        }
    }
    data = tdata;
    width = (uint32_t)w;
    height = (uint32_t)h;
}